

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall slang::parsing::Lexer::scanIdentifier(Lexer *this)

{
  byte bVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)this->sourceBuffer;
  while( true ) {
    while ((bVar1 = *pbVar2, (byte)(bVar1 - 0x30) < 10 || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a))) {
      pbVar2 = pbVar2 + 1;
      this->sourceBuffer = (char *)pbVar2;
    }
    if ((bVar1 != 0x5f) && (bVar1 != 0x24)) break;
    pbVar2 = pbVar2 + 1;
    this->sourceBuffer = (char *)pbVar2;
    if ((bVar1 != 0x24) && (bVar1 != 0x5f)) {
      return;
    }
  }
  return;
}

Assistant:

void Lexer::scanIdentifier() {
    while (true) {
        char c = peek();
        if (isAlphaNumeric(c) || c == '_' || c == '$')
            advance();
        else
            return;
    }
}